

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

vector<Range,_std::allocator<Range>_> *
addRanges(vector<Range,_std::allocator<Range>_> *__return_storage_ptr__,Range *limits,
         vector<Range,_std::allocator<Range>_> *ranges,
         vector<Range,_std::allocator<Range>_> *additions)

{
  pointer pRVar1;
  bool bVar2;
  Range *range;
  pointer pRVar3;
  
  (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar1 = (ranges->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar3 = (ranges->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
                super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    bVar2 = Range::overlaps(limits,pRVar3);
    if (bVar2) {
      std::vector<Range,_std::allocator<Range>_>::push_back(__return_storage_ptr__,pRVar3);
    }
  }
  pRVar1 = (additions->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar3 = (additions->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
                super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    bVar2 = Range::overlaps(limits,pRVar3);
    if (bVar2) {
      std::vector<Range,_std::allocator<Range>_>::push_back(__return_storage_ptr__,pRVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <Range> addRanges (
  const Range& limits,
  const std::vector <Range>& ranges,
  const std::vector <Range>& additions)
{
  std::vector <Range> results;

  for (auto& range : ranges)
    if (limits.overlaps (range))
      results.push_back (range);

  for (auto& addition : additions)
    if (limits.overlaps (addition))
      results.push_back (addition);

  return results;
}